

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O3

int luaT_callbinTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  TValue *f;
  
  f = luaT_gettmbyobj(L,p1,event);
  if ((f->tt_ == 0) && (f = luaT_gettmbyobj(L,p2,event), f->tt_ == 0)) {
    return 0;
  }
  luaT_callTM(L,f,p1,p2,res,1);
  return 1;
}

Assistant:

int luaT_callbinTM (lua_State *L, const TValue *p1, const TValue *p2,
                    StkId res, TMS event) {
  const TValue *tm = luaT_gettmbyobj(L, p1, event);  /* try first operand */
  if (ttisnil(tm))
    tm = luaT_gettmbyobj(L, p2, event);  /* try second operand */
  if (ttisnil(tm)) return 0;
  luaT_callTM(L, tm, p1, p2, res, 1);
  return 1;
}